

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.cpp
# Opt level: O1

void ncnn::matmul_transb(Mat *A,Mat *B,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  float *pfVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  void *pvVar10;
  long lVar11;
  float fVar12;
  
  iVar1 = A->h;
  if (0 < (long)iVar1) {
    uVar2 = A->w;
    iVar3 = B->h;
    pvVar7 = A->data;
    pvVar4 = B->data;
    pvVar5 = top_blob->data;
    lVar8 = 0;
    do {
      if (0 < iVar3) {
        pfVar6 = (float *)((long)pvVar5 + lVar8 * iVar3 * 4);
        lVar11 = 0;
        pvVar10 = pvVar4;
        do {
          fVar12 = 0.0;
          if (0 < (int)uVar2) {
            uVar9 = 0;
            do {
              fVar12 = fVar12 + *(float *)((long)pvVar10 + uVar9 * 4) *
                                *(float *)((long)pvVar7 + uVar9 * 4);
              uVar9 = uVar9 + 1;
            } while (uVar2 != uVar9);
          }
          *pfVar6 = fVar12;
          pfVar6 = pfVar6 + 1;
          lVar11 = lVar11 + 1;
          pvVar10 = (void *)((long)pvVar10 + (long)(int)uVar2 * 4);
        } while (lVar11 != iVar3);
      }
      lVar8 = lVar8 + 1;
      pvVar7 = (void *)((long)pvVar7 + (long)(int)uVar2 * 4);
    } while (lVar8 != iVar1);
  }
  return;
}

Assistant:

static void matmul_transb(const Mat& A, const Mat& B, Mat& top_blob, const Option& opt)
{
    const int M = A.h;
    const int K = A.w; // assert A.w == B.w
    const int N = B.h;

    const float* pA = A;
    const float* pB = B;
    float* pOut = top_blob;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < M; i++)
    {
        const float* ptrA = pA + i * K;
        float* outptr = pOut + i * N;

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = pB + j * K;

            float sum = 0.f;
            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            *outptr++ = sum;
        }
    }
}